

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void __thiscall
pbrt::FormattingParserTarget::Integrator
          (FormattingParserTarget *this,string *name,ParsedParameterVector *params,FileLoc loc)

{
  undefined1 uVar1;
  bool bVar2;
  ostream *poVar3;
  ParameterDictionary *in_RDX;
  long in_RDI;
  string lss;
  vector<int,_std::allocator<int>_> iterations;
  string extra;
  ParameterDictionary dict;
  string *in_stack_fffffffffffffc38;
  ParameterDictionary *in_stack_fffffffffffffc40;
  undefined7 in_stack_fffffffffffffc48;
  undefined1 in_stack_fffffffffffffc4f;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *in_stack_fffffffffffffc50;
  undefined8 in_stack_fffffffffffffc60;
  int extra_00;
  FormattingParserTarget *in_stack_fffffffffffffc68;
  RGBColorSpace *in_stack_fffffffffffffc70;
  ParsedParameterVector *in_stack_fffffffffffffc78;
  ParameterDictionary *in_stack_fffffffffffffc80;
  undefined7 in_stack_fffffffffffffc88;
  string *name_00;
  int indentCount;
  ParameterDictionary *in_stack_fffffffffffffcb8;
  string local_328 [32];
  string local_308 [32];
  string local_2e8 [32];
  string local_2c8 [32];
  string local_2a8 [32];
  string local_288 [39];
  allocator<char> local_261;
  string local_260 [39];
  allocator<char> local_239;
  string local_238 [39];
  undefined1 local_211 [33];
  string local_1f0 [39];
  undefined1 local_1c9 [40];
  undefined1 local_1a1 [64];
  undefined1 local_161 [40];
  undefined1 local_139 [33];
  string local_118 [48];
  undefined1 local_e8 [232];
  
  extra_00 = (int)((ulong)in_stack_fffffffffffffc60 >> 0x20);
  indentCount = (int)((ulong)local_e8 >> 0x20);
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::InlinedVector(in_stack_fffffffffffffc50,
                  (InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
                   *)CONCAT17(in_stack_fffffffffffffc4f,in_stack_fffffffffffffc48));
  ParameterDictionary::ParameterDictionary
            (in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,in_stack_fffffffffffffc70);
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::~InlinedVector(&in_stack_fffffffffffffc40->params);
  std::__cxx11::string::string(local_118);
  if ((*(byte *)(in_RDI + 0x11) & 1) != 0) {
    name_00 = (string *)local_139;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffc80,(char *)in_stack_fffffffffffffc78,
               (allocator<char> *)in_stack_fffffffffffffc70);
    ParameterDictionary::RemoveFloat(in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
    std::__cxx11::string::~string((string *)(local_139 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_139);
    uVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffffc40,(char *)in_stack_fffffffffffffc38);
    if ((bool)uVar1) {
      in_stack_fffffffffffffc80 = (ParameterDictionary *)local_161;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffc80,(char *)in_stack_fffffffffffffc78,
                 (allocator<char> *)in_stack_fffffffffffffc70);
      ParameterDictionary::RemoveInt(in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
      std::__cxx11::string::~string((string *)(local_161 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_161);
      in_stack_fffffffffffffc78 = (ParsedParameterVector *)local_1a1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffc80,(char *)in_stack_fffffffffffffc78,
                 (allocator<char> *)in_stack_fffffffffffffc70);
      ParameterDictionary::GetIntArray
                ((ParameterDictionary *)
                 CONCAT17(in_stack_fffffffffffffc4f,in_stack_fffffffffffffc48),
                 (string *)in_stack_fffffffffffffc40);
      std::__cxx11::string::~string((string *)(local_1a1 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_1a1);
      bVar2 = std::vector<int,_std::allocator<int>_>::empty
                        ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffc50);
      if (!bVar2) {
        in_stack_fffffffffffffc70 = (RGBColorSpace *)local_1c9;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffc80,(char *)in_stack_fffffffffffffc78,
                   (allocator<char> *)in_stack_fffffffffffffc70);
        ParameterDictionary::RemoveInt(in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
        std::__cxx11::string::~string((string *)(local_1c9 + 1));
        std::allocator<char>::~allocator((allocator<char> *)local_1c9);
        Warning((FileLoc *)in_stack_fffffffffffffc40,(char *)in_stack_fffffffffffffc38);
      }
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffc50);
    }
    in_stack_fffffffffffffc68 = (FormattingParserTarget *)local_211;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffc80,(char *)in_stack_fffffffffffffc78,
               (allocator<char> *)in_stack_fffffffffffffc70);
    extra_00 = (int)((ulong)&local_239 >> 0x20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffc80,(char *)in_stack_fffffffffffffc78,
               (allocator<char> *)in_stack_fffffffffffffc70);
    ParameterDictionary::GetOneString
              (in_RDX,name_00,(string *)CONCAT17(uVar1,in_stack_fffffffffffffc88));
    std::__cxx11::string::~string(local_238);
    std::allocator<char>::~allocator(&local_239);
    std::__cxx11::string::~string((string *)(local_211 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_211);
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffffc40,(char *)in_stack_fffffffffffffc38);
    if (bVar2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffc80,(char *)in_stack_fffffffffffffc78,
                 (allocator<char> *)in_stack_fffffffffffffc70);
      ParameterDictionary::RemoveString(in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
      std::__cxx11::string::~string(local_260);
      std::allocator<char>::~allocator(&local_261);
      indent_abi_cxx11_(in_stack_fffffffffffffc68,extra_00);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffffc4f,in_stack_fffffffffffffc48),
                     (char *)in_stack_fffffffffffffc40);
      std::__cxx11::string::operator+=(local_118,local_288);
      std::__cxx11::string::~string(local_288);
      std::__cxx11::string::~string(local_2a8);
    }
    std::__cxx11::string::~string(local_1f0);
  }
  if (((*(byte *)(in_RDI + 0x11) & 1) == 0) ||
     (uVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffffc40,(char *)in_stack_fffffffffffffc38),
     !(bool)uVar1)) {
    indent_abi_cxx11_(in_stack_fffffffffffffc68,extra_00);
    Printf<std::__cxx11::string,std::__cxx11::string_const&>
              ((char *)in_stack_fffffffffffffc80,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffc78,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffc70);
    std::__cxx11::string::~string(local_328);
  }
  else {
    indent_abi_cxx11_(in_stack_fffffffffffffc68,extra_00);
    Printf<std::__cxx11::string>
              ((char *)in_stack_fffffffffffffc70,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffc68);
    std::__cxx11::string::~string(local_2c8);
    indent_abi_cxx11_(in_stack_fffffffffffffc68,extra_00);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(uVar1,in_stack_fffffffffffffc48),(char *)in_stack_fffffffffffffc40);
    std::__cxx11::string::operator+=(local_118,local_2e8);
    std::__cxx11::string::~string(local_2e8);
    std::__cxx11::string::~string(local_308);
  }
  poVar3 = std::operator<<((ostream *)&std::cout,local_118);
  ParameterDictionary::ToParameterList_abi_cxx11_(in_stack_fffffffffffffcb8,indentCount);
  std::operator<<(poVar3,(string *)&stack0xfffffffffffffcb8);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffcb8);
  std::__cxx11::string::~string(local_118);
  ParameterDictionary::~ParameterDictionary((ParameterDictionary *)0x4ed069);
  return;
}

Assistant:

void FormattingParserTarget::Integrator(const std::string &name,
                                        ParsedParameterVector params, FileLoc loc) {
    ParameterDictionary dict(std::move(params), RGBColorSpace::sRGB);

    std::string extra;
    if (upgrade) {
        dict.RemoveFloat("rrthreshold");

        if (name == "sppm") {
            dict.RemoveInt("imagewritefrequency");

            std::vector<int> iterations = dict.GetIntArray("numiterations");
            if (!iterations.empty()) {
                dict.RemoveInt("numiterations");
                Warning(
                    &loc,
                    "The SPPM integrator no longer takes a \"numiterations\" parameter. "
                    "This value is now set via the Sampler's number of pixel samples.");
            }
        }
        std::string lss = dict.GetOneString("lightsamplestrategy", "");
        if (lss == "spatial") {
            dict.RemoveString("lightsamplestrategy");
            extra += indent(1) + "\"string lightsamplestrategy\" \"bvh\"\n";
        }
    }

    if (upgrade && name == "directlighting") {
        Printf("%sIntegrator \"path\"\n", indent());
        extra += indent(1) + "\"integer maxdepth\" [ 1 ]\n";
    } else
        Printf("%sIntegrator \"%s\"\n", indent(), name);
    std::cout << extra << dict.ToParameterList(catIndentCount);
}